

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

void vkt::texture::util::wrapCubemapCorner
               (IVec2 *coord,IVec2 *size,int faceNdx,int *adjacentFace1,int *adjacentFace2,
               IVec2 *cornerCoord0,IVec2 *cornerCoord1,IVec2 *cornerCoord2)

{
  int iVar1;
  IVec2 *pIVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int edgeNdx;
  long lVar8;
  uint local_5c [5];
  IVec2 *local_48 [3];
  int cornerEdges [2];
  int faceCorners [3];
  IVec2 *cornerCoords [3];
  
  if (coord->m_data[0] < 0) {
    if (coord->m_data[1] < 0) {
      local_5c[0] = 0;
      goto LAB_007fd0ad;
    }
  }
  else if (coord->m_data[0] != 0) {
    if (coord->m_data[1] < 0) {
      local_5c[0] = 1;
      goto LAB_007fd0ad;
    }
    local_5c[0] = 2;
    if (coord->m_data[1] != 0) goto LAB_007fd0ad;
  }
  local_5c[0] = 3;
LAB_007fd0ad:
  local_5c[1] = local_5c[0] - 1 & 3;
  local_5c[2] = local_5c[0];
  local_5c[3] = 0;
  local_5c[4] = 0;
  lVar8 = 0;
  lVar4 = (long)faceNdx * 0x10;
  do {
    lVar5 = (long)(int)local_5c[lVar8];
    iVar7 = *(int *)((anonymous_namespace)::adjacentEdges + lVar5 * 4 + lVar4);
    if ((*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar5 * 4 + lVar4) == -1) !=
        (1 < iVar7 != 1 < lVar5)) {
      uVar3 = iVar7 + 4;
      if (-1 < (int)(iVar7 + 1U)) {
        uVar3 = iVar7 + 1U;
      }
      iVar7 = (iVar7 - (uVar3 & 0xfffffffc)) + 1;
    }
    *(int *)((long)local_48 + lVar8 * 4 + -8) = iVar7;
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  *adjacentFace1 = *(int *)((anonymous_namespace)::adjacentFaces + (ulong)local_5c[0] * 4 + lVar4);
  *adjacentFace2 = *(int *)((anonymous_namespace)::adjacentFaces + (ulong)local_5c[1] * 4 + lVar4);
  local_48[0] = cornerCoord0;
  local_48[1] = cornerCoord1;
  local_48[2] = cornerCoord2;
  uVar3 = local_5c[(long)faceNdx + 2] - 1;
  lVar4 = 0;
  do {
    iVar7 = 0;
    iVar6 = 0;
    if (uVar3 < 3) {
      iVar7 = *(int *)(&DAT_00b2a310 + (ulong)uVar3 * 4);
      iVar6 = *(int *)(&DAT_00b2a460 + (ulong)uVar3 * 4);
    }
    iVar1 = size->m_data[1];
    pIVar2 = local_48[lVar4];
    pIVar2->m_data[0] = (size->m_data[0] + -1) * iVar6;
    pIVar2->m_data[1] = (iVar1 + -1) * iVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void wrapCubemapCorner (const IVec2&	coord,
						const IVec2&	size,
						const int		faceNdx,
						int&			adjacentFace1,
						int&			adjacentFace2,
						IVec2&			cornerCoord0,
						IVec2&			cornerCoord1,
						IVec2&			cornerCoord2)
{
	int cornerNdx = -1;

	if (coord[0] < 0 && coord[1] < 0)
	{
		cornerNdx = 0;
	}
	else if (coord[0] > 0 && coord[1] < 0)
	{
		cornerNdx = 1;
	}
	else if (coord[0] > 0 && coord[1] > 0)
	{
		cornerNdx = 2;
	}
	else
	{
		cornerNdx = 3;
	}

	const int cornerEdges[2] = {cornerNdx, (int) ((cornerNdx + 3) % 4)};

	int		  faceCorners[3] = {cornerNdx, 0, 0};

	for (int edgeNdx = 0; edgeNdx < 2; ++edgeNdx)
	{
		const int faceEdge = adjacentEdges[faceNdx][cornerEdges[edgeNdx]];

		bool isFlipped = (adjacentEdgeDirs[faceNdx][cornerEdges[edgeNdx]] == -1);

		if ((cornerEdges[edgeNdx] > 1) != (faceEdge > 1))
		{
			isFlipped = !isFlipped;
		}

		if (isFlipped)
		{
			faceCorners[edgeNdx + 1] = (faceEdge + 1) % 4;
		}
		else
		{
			faceCorners[edgeNdx + 1] = faceEdge;
		}
	}

	adjacentFace1 = adjacentFaces[faceNdx][cornerEdges[0]];
	adjacentFace2 = adjacentFaces[faceNdx][cornerEdges[1]];

	IVec2* cornerCoords[3] = {&cornerCoord0, &cornerCoord1, &cornerCoord2};

	for (int ndx = 0; ndx < 3; ++ndx)
	{
		IVec2 cornerFactor;

		switch (faceCorners[faceNdx])
		{
			case 0:
				cornerFactor = IVec2(0, 0);
				break;

			case 1:
				cornerFactor = IVec2(1, 0);
				break;

			case 2:
				cornerFactor = IVec2(1, 1);
				break;

			case 3:
				cornerFactor = IVec2(0, 1);
				break;

			default:
				break;
		}

	    *cornerCoords[ndx] = cornerFactor * (size - IVec2(1));
	}
}